

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeHulls.cpp
# Opt level: O2

void __thiscall
HACD::ChUll::ChUll(ChUll *this,HaU32 vcount,HaF32 *vertices,HaU32 tcount,HaU32 *indices,HaU32 guid)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  HaF32 *vertices_00;
  HaU32 *indices_00;
  float *pfVar6;
  HaF32 HVar7;
  HaF32 HVar8;
  HaF32 HVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  this->mGuid = guid;
  this->mVertexCount = vcount;
  this->mTriangleCount = tcount;
  vertices_00 = (HaF32 *)malloc((ulong)vcount * 0xc);
  this->mVertices = vertices_00;
  memcpy(vertices_00,vertices,(ulong)vcount * 0xc);
  indices_00 = (HaU32 *)malloc((ulong)tcount * 0xc);
  this->mIndices = indices_00;
  memcpy(indices_00,indices,(ulong)tcount * 0xc);
  HVar7 = fm_computeMeshVolume(vertices_00,tcount,indices_00);
  this->mVolume = HVar7;
  HVar7 = *vertices_00;
  HVar8 = vertices_00[1];
  HVar9 = vertices_00[2];
  pfVar6 = (float *)(vertices_00 + 5);
  uVar5 = 1;
  fVar12 = (float)HVar7;
  fVar11 = (float)HVar8;
  fVar10 = (float)HVar9;
  while( true ) {
    if (vcount <= uVar5) break;
    fVar1 = pfVar6[-2];
    if (fVar1 < fVar12) {
      this->mMin[0] = (HaF32)fVar1;
      fVar12 = fVar1;
    }
    fVar2 = pfVar6[-1];
    if (fVar2 < fVar11) {
      this->mMin[1] = (HaF32)fVar2;
      fVar11 = fVar2;
    }
    fVar3 = *pfVar6;
    if (fVar3 < (float)HVar9) {
      this->mMin[2] = (HaF32)fVar3;
      HVar9 = (HaF32)fVar3;
    }
    if ((float)HVar7 < fVar1) {
      this->mMax[0] = (HaF32)fVar1;
      HVar7 = (HaF32)fVar1;
    }
    if ((float)HVar8 < fVar2) {
      this->mMax[1] = (HaF32)fVar2;
      HVar8 = (HaF32)fVar2;
    }
    if (fVar10 < fVar3) {
      this->mMax[2] = (HaF32)fVar3;
      fVar10 = fVar3;
    }
    uVar5 = uVar5 + 1;
    pfVar6 = pfVar6 + 3;
  }
  fVar1 = (float)HVar8 - fVar11;
  fVar2 = (float)HVar7 - fVar12;
  fVar3 = fVar10 - (float)HVar9;
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar1)),ZEXT416((uint)fVar2),ZEXT416((uint)fVar2))
  ;
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar3),ZEXT416((uint)fVar3));
  auVar4 = vsqrtss_avx(auVar4,auVar4);
  this->mDiagonal = auVar4._0_4_;
  this->mMin[0] = (HaF32)(fVar12 - fVar2 * 0.1);
  this->mMin[1] = (HaF32)(fVar11 - fVar1 * 0.1);
  this->mMin[2] = (HaF32)((float)HVar9 - fVar3 * 0.1);
  this->mMax[0] = (HaF32)((float)HVar7 + fVar2 * 0.1);
  this->mMax[1] = (HaF32)((float)HVar8 + fVar1 * 0.1);
  this->mMax[2] = (HaF32)(fVar3 * 0.1 + fVar10);
  return;
}

Assistant:

ChUll(HaU32 vcount,const HaF32 *vertices,HaU32 tcount,const HaU32 *indices,HaU32 guid)
		{
			mGuid = guid;
			mVertexCount = vcount;
			mTriangleCount = tcount;
			mVertices = (HaF32 *)HACD_ALLOC(sizeof(HaF32)*3*vcount);
			memcpy(mVertices,vertices,sizeof(HaF32)*3*vcount);
			mIndices = (HaU32 *)HACD_ALLOC(sizeof(HaU32)*3*tcount);
			memcpy(mIndices,indices,sizeof(HaU32)*3*tcount);
			mVolume = fm_computeMeshVolume( mVertices, mTriangleCount, mIndices);
			mDiagonal = fm_computeBestFitAABB( mVertexCount, mVertices, sizeof(hacd::HaF32)*3, mMin, mMax );
			hacd::HaF32 dx = mMax[0] - mMin[0];
			hacd::HaF32 dy = mMax[1] - mMin[1];
			hacd::HaF32 dz = mMax[2] - mMin[2];
			dx*=0.1f; // inflate 1/10th on each edge
			dy*=0.1f; // inflate 1/10th on each edge
			dz*=0.1f; // inflate 1/10th on each edge
			mMin[0]-=dx;
			mMin[1]-=dy;
			mMin[2]-=dz;
			mMax[0]+=dx;
			mMax[1]+=dy;
			mMax[2]+=dz;
		}